

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

void __thiscall Potassco::StringBuilder::~StringBuilder(StringBuilder *this)

{
  string *this_00;
  uint8_t uVar1;
  StringBuilder *in_RDI;
  
  uVar1 = tag(in_RDI);
  if ((uVar1 == 'A') && (this_00 = (in_RDI->field_0).str_, this_00 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

StringBuilder::~StringBuilder() {
	if (tag() == (Str|Own)) {
		delete str_;
	}
}